

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

bool ValidateXrEnum(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                   string *validation_name,string *item_name,
                   vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                   *objects_info,XrBodyJointSetBD value)

{
  bool bVar1;
  allocator local_89;
  string vuid;
  string error_str;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_48;
  
  if ((instance_info != (GenValidUsageXrInstanceInfo *)0x0) &&
     (bVar1 = ExtensionEnabled(&instance_info->enabled_extensions,"XR_BD_body_tracking"), !bVar1)) {
    std::__cxx11::string::string((string *)&vuid,"VUID-",(allocator *)&error_str);
    std::__cxx11::string::append((string *)&vuid);
    std::__cxx11::string::append((char *)&vuid);
    std::__cxx11::string::append((string *)&vuid);
    std::__cxx11::string::append((char *)&vuid);
    std::__cxx11::string::string
              ((string *)&error_str,"XrBodyJointSetBD requires extension ",&local_89);
    std::__cxx11::string::append((char *)&error_str);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_48,objects_info);
    CoreValidLogMessage(instance_info,&vuid,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_48,&error_str);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_48);
    std::__cxx11::string::~string((string *)&error_str);
    std::__cxx11::string::~string((string *)&vuid);
    return false;
  }
  return value - XR_BODY_JOINT_SET_BODY_WITHOUT_ARM_BD < 2;
}

Assistant:

bool ValidateXrEnum(GenValidUsageXrInstanceInfo *instance_info,
                    const std::string &command_name,
                    const std::string &validation_name,
                    const std::string &item_name,
                    std::vector<GenValidUsageXrObjectInfo>& objects_info,
                    const XrBodyJointSetBD value) {
    (void)instance_info;  // quiet warnings
    (void)command_name;  // quiet warnings
    (void)validation_name;  // quiet warnings
    (void)item_name;  // quiet warnings
    (void)objects_info;  // quiet warnings
    // Enum requires extension XR_BD_body_tracking, so check that it is enabled
    if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_BD_body_tracking")) {
        std::string vuid = "VUID-";
        vuid += validation_name;
        vuid += "-";
        vuid += item_name;
        vuid += "-parameter";
        std::string error_str = "XrBodyJointSetBD requires extension ";
        error_str += " \"XR_BD_body_tracking\" to be enabled, but it is not enabled";
        CoreValidLogMessage(instance_info, vuid,
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, error_str);
        return false;
    }
    switch (value) {
        case XR_BODY_JOINT_SET_BODY_WITHOUT_ARM_BD:
            return true;
        case XR_BODY_JOINT_SET_FULL_BODY_JOINTS_BD:
            return true;
    default:
        return false;
}
}